

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::CustomLayerParams::MergePartialFromCodedStream
          (CustomLayerParams *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
  *pMVar1;
  byte *pbVar2;
  byte bVar3;
  byte *pbVar4;
  uint8 *puVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  uint32 uVar9;
  Type *this_01;
  pair<int,_int> pVar10;
  char *field_name;
  char cVar11;
  ulong uVar12;
  string *psVar13;
  pointer data;
  ArenaStringPtr *this_02;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
  parser;
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
  local_70;
  
  this_00 = &this->description_;
  pMVar1 = &(this->parameters_).map_;
  this_02 = &this->classname_;
  do {
    pbVar4 = input->buffer_;
    uVar9 = 0;
    if (pbVar4 < input->buffer_end_) {
      bVar3 = *pbVar4;
      uVar12 = (ulong)bVar3;
      pbVar2 = pbVar4 + 1;
      uVar7 = (uint)bVar3;
      if ((char)bVar3 < '\x01') {
        uVar9 = (uint)bVar3;
        if ((input->buffer_end_ <= pbVar2) || (uVar9 = uVar7, (~(uint)*pbVar2 & uVar7) < 0x80))
        goto LAB_00497038;
        uVar12 = (ulong)((uVar7 + (uint)*pbVar2 * 0x80) - 0x80);
        input->buffer_ = pbVar4 + 2;
      }
      else {
        input->buffer_ = pbVar2;
      }
      uVar12 = uVar12 | 0x100000000;
    }
    else {
LAB_00497038:
      uVar9 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar9);
      uVar12 = 0;
      if (uVar9 - 1 < 0x3fff) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar9 | uVar12;
    }
    uVar9 = (uint32)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto LAB_00496dad;
    uVar7 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar11 = (char)uVar12;
    if (uVar7 < 0x1e) {
      if (uVar7 == 10) {
        if (cVar11 != 'R') goto LAB_00496dad;
        psVar13 = this_02->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_02,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_02->ptr_;
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (!bVar6) goto LAB_0049706e;
        data = (this_02->ptr_->_M_dataplus)._M_p;
        iVar8 = (int)this_02->ptr_->_M_string_length;
        field_name = "CoreML.Specification.CustomLayerParams.className";
LAB_00496edd:
        bVar6 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (data,iVar8,PARSE,field_name);
      }
      else {
        if ((uVar7 != 0x14) || (cVar11 != -0x5e)) goto LAB_00496dad;
        this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::WeightParams>::TypeHandler>
                            (&(this->weights_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < iVar8)) {
          input->buffer_ = puVar5 + 1;
        }
        else {
          iVar8 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar8 < 0) goto LAB_0049706e;
        }
        pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar8);
        if (((long)pVar10 < 0) ||
           (bVar6 = WeightParams::MergePartialFromCodedStream(this_01,input), !bVar6))
        goto LAB_0049706e;
        bVar6 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                          (input,pVar10.first);
      }
LAB_00496dcd:
      if (bVar6 == false) goto LAB_0049706e;
LAB_00496dd5:
      iVar8 = 0;
    }
    else {
      if (uVar7 != 0x1e) {
        if ((uVar7 != 0x28) || (cVar11 != 'B')) {
LAB_00496dad:
          if (uVar9 == 0) {
            return true;
          }
          if ((uVar9 & 7) == 4) {
            return true;
          }
          bVar6 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar9);
          goto LAB_00496dcd;
        }
        psVar13 = this_00->ptr_;
        if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_)
        {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
          psVar13 = this_00->ptr_;
        }
        bVar6 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
        if (bVar6) {
          data = (this_00->ptr_->_M_dataplus)._M_p;
          iVar8 = (int)this_00->ptr_->_M_string_length;
          field_name = "CoreML.Specification.CustomLayerParams.description";
          goto LAB_00496edd;
        }
        goto LAB_0049706e;
      }
      if (cVar11 != -0xe) goto LAB_00496dad;
      local_70.key_._M_dataplus._M_p = (pointer)&local_70.key_.field_2;
      local_70.key_._M_string_length = 0;
      local_70.key_.field_2._M_local_buf[0] = '\0';
      local_70.entry_.ptr_ =
           (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
            *)0x0;
      puVar5 = input->buffer_;
      local_70.mf_ = &this->parameters_;
      local_70.map_ = pMVar1;
      if ((puVar5 < input->buffer_end_) && (iVar8 = (int)(char)*puVar5, -1 < (char)*puVar5)) {
        input->buffer_ = puVar5 + 1;
LAB_00496f91:
        pVar10 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                           (input,iVar8);
        if ((((long)pVar10 < 0) ||
            (bVar6 = google::protobuf::internal::
                     MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
                     ::
                     Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue>_>
                     ::MergePartialFromCodedStream(&local_70,input), !bVar6)) ||
           (bVar6 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                              (input,pVar10.first), !bVar6)) goto LAB_00497062;
        bVar6 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (local_70.key_._M_dataplus._M_p,(int)local_70.key_._M_string_length,PARSE,
                           "CoreML.Specification.CustomLayerParams.ParametersEntry.key");
        iVar8 = 6;
        if (bVar6) {
          iVar8 = 0;
        }
      }
      else {
        iVar8 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (-1 < iVar8) goto LAB_00496f91;
LAB_00497062:
        iVar8 = 6;
        bVar6 = false;
      }
      if (local_70.entry_.ptr_ !=
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::CustomLayerParams_CustomLayerParamValue,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11,_0>
           *)0x0) {
        (*((local_70.entry_.ptr_)->super_MessageLite)._vptr_MessageLite[1])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.key_._M_dataplus._M_p != &local_70.key_.field_2) {
        operator_delete(local_70.key_._M_dataplus._M_p,
                        CONCAT71(local_70.key_.field_2._M_allocated_capacity._1_7_,
                                 local_70.key_.field_2._M_local_buf[0]) + 1);
      }
      if (bVar6 != false) goto LAB_00496dd5;
    }
  } while (iVar8 == 0);
  bVar6 = true;
  if (iVar8 == 6) {
LAB_0049706e:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool CustomLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CustomLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string className = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_classname()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->classname().data(), this->classname().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomLayerParams.className"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.WeightParams weights = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // map<string, .CoreML.Specification.CustomLayerParams.CustomLayerParamValue> parameters = 30;
      case 30: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(242u)) {
          CustomLayerParams_ParametersEntry::Parser< ::google::protobuf::internal::MapFieldLite<
              CustomLayerParams_ParametersEntry,
              ::std::string, ::CoreML::Specification::CustomLayerParams_CustomLayerParamValue,
              ::google::protobuf::internal::WireFormatLite::TYPE_STRING,
              ::google::protobuf::internal::WireFormatLite::TYPE_MESSAGE,
              0 >,
            ::google::protobuf::Map< ::std::string, ::CoreML::Specification::CustomLayerParams_CustomLayerParamValue > > parser(&parameters_);
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
              input, &parser));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            parser.key().data(), parser.key().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomLayerParams.ParametersEntry.key"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string description = 40;
      case 40: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(322u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_description()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->description().data(), this->description().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CustomLayerParams.description"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CustomLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CustomLayerParams)
  return false;
#undef DO_
}